

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_unit.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_7fba::ShadowedART::assertLowerBoundValid(ShadowedART *this,Key key)

{
  bool bVar1;
  iterator iVar2;
  int line;
  _Base_ptr __one;
  char *expression;
  art_iterator_t art_it;
  string local_f8;
  key_type local_d8;
  Key local_ce;
  string local_c8;
  art_iterator_t local_a8;
  
  local_d8.key_._M_elems._0_4_ = key.key_._M_elems._0_4_;
  local_d8.key_._M_elems._4_2_ = key.key_._M_elems._4_2_;
  iVar2 = std::
          map<(anonymous_namespace)::Key,_(anonymous_namespace)::Value,_std::less<(anonymous_namespace)::Key>,_std::allocator<std::pair<const_(anonymous_namespace)::Key,_(anonymous_namespace)::Value>_>_>
          ::lower_bound(&this->shadow_,&local_d8);
  art_lower_bound(&local_a8,(art_t *)&this->art_,(art_key_chunk_t *)&local_d8);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->shadow_)._M_t._M_impl.super__Rb_tree_header) {
    if (local_a8.value == (art_val_t *)0x0) {
      return;
    }
    puts("Iterator is not null");
    bVar1 = local_a8.value == (art_val_t *)0x0;
    expression = "art_it->value == nullptr";
    line = 0x94;
  }
  else {
    if (local_a8.value == (art_val_t *)0x0) {
      (anonymous_namespace)::Key::string_abi_cxx11_(&local_f8,iVar2._M_node + 1);
      printf("Iterator for key %s is null\n",local_f8._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_f8);
      _assert_true((ulong)(local_a8.value != (art_val_t *)0x0),"art_it->value != nullptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
                   ,0x90);
    }
    __one = iVar2._M_node + 1;
    Key::Key((Key *)&local_f8,local_a8.key);
    bVar1 = std::operator==((array<unsigned_char,_6UL> *)__one,
                            (array<unsigned_char,_6UL> *)&local_f8);
    if (bVar1) {
      return;
    }
    (anonymous_namespace)::Key::string_abi_cxx11_(&local_f8,__one);
    Key::Key(&local_ce,local_a8.key);
    (anonymous_namespace)::Key::string_abi_cxx11_(&local_c8,&local_ce);
    printf("Shadow iterator key = %s, ART key = %s\n",local_f8._M_dataplus._M_p,
           local_c8._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_f8);
    Key::Key((Key *)&local_f8,local_a8.key);
    bVar1 = std::operator==((array<unsigned_char,_6UL> *)__one,
                            (array<unsigned_char,_6UL> *)&local_f8);
    expression = "shadow_it->first == Key(art_it->key)";
    line = 0x9b;
  }
  _assert_true((ulong)bVar1,expression,
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,line);
  return;
}

Assistant:

void assertLowerBoundValid(Key key) {
        auto shadow_it = shadow_.lower_bound(key);
        auto art_it = art_lower_bound(&art_, key.data());
        assertIteratorValid(shadow_it, &art_it);
    }